

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O3

bool __thiscall
glcts::TessellationShaderTessellationMaxInOut::compareValues
          (TessellationShaderTessellationMaxInOut *this,char *description,GLfloat *reference_values,
          int n_reference_values)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar3;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  lVar4 = (**(code **)(lVar3 + 0xd00))(0x8c8e,0,(long)(n_reference_values << 5),1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glMapBufferRange() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xb29);
  bVar8 = true;
  if (0 < n_reference_values << 2) {
    lVar6 = 0;
    uVar9 = 0;
    do {
      fVar10 = *(float *)(lVar4 + uVar9 * 4) - reference_values[uVar9];
      fVar11 = -fVar10;
      if (-fVar10 <= fVar10) {
        fVar11 = fVar10;
      }
      if (1e-05 < fVar11) {
LAB_00d432e0:
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        if (description == (char *)0x0) {
          std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
        }
        else {
          sVar5 = strlen(description);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,description,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,": captured results ",0x13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"vec4(",5);
        std::ostream::_M_insert<double>((double)*(float *)(lVar4 + uVar9 * 4));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
        uVar7 = lVar6 >> 0x20;
        std::ostream::_M_insert<double>((double)*(float *)(lVar4 + 4 + uVar7 * 4));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
        std::ostream::_M_insert<double>((double)*(float *)(lVar4 + 8 + uVar7 * 4));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
        std::ostream::_M_insert<double>((double)*(float *)(lVar4 + 0xc + uVar7 * 4));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"are different from the expected values ",0x27);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"vec4(",5);
        std::ostream::_M_insert<double>((double)reference_values[uVar9]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
        std::ostream::_M_insert<double>((double)reference_values[uVar7 | 1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
        std::ostream::_M_insert<double>((double)reference_values[uVar7 | 2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
        std::ostream::_M_insert<double>((double)reference_values[uVar7 | 3]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,").",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar8 = false;
        break;
      }
      fVar10 = *(float *)(lVar4 + 4 + uVar9 * 4) - reference_values[uVar9 + 1];
      fVar11 = -fVar10;
      if (-fVar10 <= fVar10) {
        fVar11 = fVar10;
      }
      if (1e-05 < fVar11) goto LAB_00d432e0;
      fVar10 = *(float *)(lVar4 + 8 + uVar9 * 4) - reference_values[uVar9 + 2];
      fVar11 = -fVar10;
      if (-fVar10 <= fVar10) {
        fVar11 = fVar10;
      }
      if (1e-05 < fVar11) goto LAB_00d432e0;
      fVar10 = *(float *)(lVar4 + 0xc + uVar9 * 4) - reference_values[uVar9 + 3];
      fVar11 = -fVar10;
      if (-fVar10 <= fVar10) {
        fVar11 = fVar10;
      }
      if (1e-05 < fVar11) goto LAB_00d432e0;
      uVar9 = uVar9 + 4;
      lVar6 = lVar6 + 0x400000000;
    } while (uVar9 < (uint)(n_reference_values << 2));
  }
  (**(code **)(lVar3 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glUnmapBuffer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xb44);
  return bVar8;
}

Assistant:

bool TessellationShaderTessellationMaxInOut::compareValues(char const* description, glw::GLfloat* reference_values,
														   int n_reference_values)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Map the buffer storage into process space. */
	glw::GLint bo_size = static_cast<glw::GLint>(2 /* number of vertices */ * sizeof(glw::GLfloat) *
												 n_reference_values * 4); /* number of components */
	glw::GLfloat* resultFloats =
		(glw::GLfloat*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, bo_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");

	/* Verify the data */
	const glw::GLfloat epsilon	 = (glw::GLfloat)1e-5f;
	bool			   test_passed = true;

	for (int i = 0; i < n_reference_values * 4 /* number of components */; i += 4 /* number of components */)
	{
		if ((de::abs(resultFloats[i] - reference_values[i]) > epsilon) ||
			(de::abs(resultFloats[i + 1] - reference_values[i + 1]) > epsilon) ||
			(de::abs(resultFloats[i + 2] - reference_values[i + 2]) > epsilon) ||
			(de::abs(resultFloats[i + 3] - reference_values[i + 3]) > epsilon))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << description << ": captured results "
							   << "vec4(" << resultFloats[i + 0] << ", " << resultFloats[i + 1] << ", "
							   << resultFloats[i + 2] << ", " << resultFloats[i + 3] << ") "
							   << "are different from the expected values "
							   << "vec4(" << reference_values[i + 0] << ", " << reference_values[i + 1] << ", "
							   << reference_values[i + 2] << ", " << reference_values[i + 3] << ")."
							   << tcu::TestLog::EndMessage;

			test_passed = false;
			break;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed!");

	return test_passed;
}